

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_meta_is_slice_specifier.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  bool local_31;
  
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<int>, false_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x20,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<int[2]>, false_type >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x23,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<initializer_list<int> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x27,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<initializer_list<int&> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x2a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<initializer_list<float> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x2d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<int, int> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x31,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<int, unsigned> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x34,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<int&, int&> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x37,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<int&, int> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x3a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<float, float> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x3d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<pair<int, float> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x40,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<int, int> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x44,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<int, unsigned> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x47,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<int&, int&> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x4a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<int&, int> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x4d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<float, float> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x50,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<tuple<int, float> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x53,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<array<int, 2> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x57,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<array<int&, 2> >, true_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x5a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<array<float, 2> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x5d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<array<int, 3> >, false_type >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x60,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_integral_range_slice_specifier<all_tag>, true_type >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,100,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<int>, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x6a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<float>, false_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x6d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<initializer_list<int> >, true_type >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x71,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<initializer_list<float> >, false_type >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x74,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<pair<int, int> >, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x78,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<pair<float, float> >, false_type >::value)","true"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x7b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<tuple<int, int> >, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x7f,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<tuple<float, float> >, false_type >::value)",
             "true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x82,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<array<int, 2> >, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x86,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<array<float, 2> >, false_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x89,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< is_slice_specifier<all_tag>, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x8d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< pack_is_slice_specifiers<>, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x93,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< pack_is_slice_specifiers<int>, true_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x97,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_convertible< pack_is_slice_specifiers<float>, false_type >::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0x9a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(pack_is_slice_specifiers< initializer_list<int> , pair<int, int> , tuple<int, int> , array<int, 2> , all_tag >::value)"
             ,"true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0xa2,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_31);
  local_31 = false;
  boost::detail::test_eq_impl<bool,bool>
            ("(pack_is_slice_specifiers< initializer_list<int> , pair<int, int> , tuple<int, int> , array<int, 2> , all_tag , float >::value)"
             ,"false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_is_slice_specifier.cpp"
             ,0xab,"int main()",(bool *)&std::integral_constant<bool,false>::value,&local_31);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<int>,    false_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<int[2]>, false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<initializer_list<int> >,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<initializer_list<int&> >,  true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<initializer_list<float> >, false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<int, int> >,      true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<int, unsigned> >, true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<int&, int&> >,    true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<int&, int> >,     true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<float, float> >,  false_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<pair<int, float> >,    false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<int, int> >,      true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<int, unsigned> >, true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<int&, int&> >,    true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<int&, int> >,     true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<float, float> >,  false_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<tuple<int, float> >,    false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<array<int, 2> >,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<array<int&, 2> >,  true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<array<float, 2> >, false_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<array<int, 3> >,   false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_integral_range_slice_specifier<all_tag>, true_type
    >::value), true);

    ///////////////////////////////////////////////////////////////////////////

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<int>,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<float>, false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<initializer_list<int> >,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<initializer_list<float> >, false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<pair<int, int> >,      true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<pair<float, float> >,  false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<tuple<int, int> >,      true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<tuple<float, float> >,  false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<array<int, 2> >,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<array<float, 2> >, false_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        is_slice_specifier<all_tag>, true_type
    >::value), true);

    ///////////////////////////////////////////////////////////////////////////
    
    BOOST_TEST_EQ((is_convertible<
        pack_is_slice_specifiers<>, true_type
    >::value), true);

    BOOST_TEST_EQ((is_convertible<
        pack_is_slice_specifiers<int>,   true_type
    >::value), true);
    BOOST_TEST_EQ((is_convertible<
        pack_is_slice_specifiers<float>, false_type
    >::value), true);

    BOOST_TEST_EQ((pack_is_slice_specifiers<
        initializer_list<int>
      , pair<int, int>
      , tuple<int, int>
      , array<int, 2>
      , all_tag
    >::value), true);

    BOOST_TEST_EQ((pack_is_slice_specifiers<
        initializer_list<int>
      , pair<int, int>
      , tuple<int, int>
      , array<int, 2>
      , all_tag
      , float
    >::value), false);

    return boost::report_errors();
}